

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

void __thiscall btQuantizedBvh::buildInternal(btQuantizedBvh *this)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  btQuantizedBvhNode *ptr;
  btBvhSubtreeInfo *pbVar5;
  btOptimizedBvhNode *ptr_00;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  btQuantizedBvhNode *pbVar10;
  long lVar11;
  btBvhSubtreeInfo *pbVar12;
  long lVar13;
  int iVar14;
  
  this->m_useQuantization = true;
  iVar9 = (this->m_quantizedLeafNodes).m_size;
  iVar14 = iVar9 * 2;
  iVar4 = (this->m_quantizedContiguousNodes).m_size;
  if ((iVar4 <= iVar14) && (iVar4 < iVar14)) {
    if ((this->m_quantizedContiguousNodes).m_capacity < iVar14) {
      if (iVar9 == 0) {
        pbVar10 = (btQuantizedBvhNode *)0x0;
      }
      else {
        pbVar10 = (btQuantizedBvhNode *)btAlignedAllocInternal((long)iVar9 << 5,0x10);
      }
      lVar11 = (long)(this->m_quantizedContiguousNodes).m_size;
      if (0 < lVar11) {
        lVar13 = 0;
        do {
          puVar2 = (undefined8 *)
                   ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar13);
          uVar6 = puVar2[1];
          puVar3 = (undefined8 *)((long)pbVar10->m_quantizedAabbMin + lVar13);
          *puVar3 = *puVar2;
          puVar3[1] = uVar6;
          lVar13 = lVar13 + 0x10;
        } while (lVar11 * 0x10 != lVar13);
      }
      ptr = (this->m_quantizedContiguousNodes).m_data;
      if (ptr != (btQuantizedBvhNode *)0x0) {
        if ((this->m_quantizedContiguousNodes).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_quantizedContiguousNodes).m_data = (btQuantizedBvhNode *)0x0;
      }
      (this->m_quantizedContiguousNodes).m_ownsMemory = true;
      (this->m_quantizedContiguousNodes).m_data = pbVar10;
      (this->m_quantizedContiguousNodes).m_capacity = iVar14;
    }
    if (iVar4 < iVar14) {
      lVar11 = (long)iVar14 - (long)iVar4;
      lVar13 = (long)iVar4 << 4;
      do {
        puVar2 = (undefined8 *)
                 ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar13);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar13 = lVar13 + 0x10;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
  }
  (this->m_quantizedContiguousNodes).m_size = iVar14;
  this->m_curNodeIndex = 0;
  buildTree(this,0,iVar9);
  if (this->m_useQuantization == true) {
    if ((this->m_SubtreeHeaders).m_size == 0) {
      if ((this->m_SubtreeHeaders).m_capacity == 0) {
        pbVar12 = (btBvhSubtreeInfo *)btAlignedAllocInternal(0x20,0x10);
        lVar11 = (long)(this->m_SubtreeHeaders).m_size;
        if (0 < lVar11) {
          lVar13 = 0;
          do {
            pbVar5 = (this->m_SubtreeHeaders).m_data;
            puVar2 = (undefined8 *)((long)pbVar5->m_quantizedAabbMin + lVar13);
            uVar6 = *puVar2;
            uVar7 = puVar2[1];
            puVar2 = (undefined8 *)((long)pbVar5->m_padding + lVar13 + -4);
            uVar8 = puVar2[1];
            puVar3 = (undefined8 *)((long)pbVar12->m_padding + lVar13 + -4);
            *puVar3 = *puVar2;
            puVar3[1] = uVar8;
            puVar2 = (undefined8 *)((long)pbVar12->m_quantizedAabbMin + lVar13);
            *puVar2 = uVar6;
            puVar2[1] = uVar7;
            lVar13 = lVar13 + 0x20;
          } while (lVar11 * 0x20 != lVar13);
        }
        pbVar5 = (this->m_SubtreeHeaders).m_data;
        if (pbVar5 != (btBvhSubtreeInfo *)0x0) {
          if ((this->m_SubtreeHeaders).m_ownsMemory == true) {
            btAlignedFreeInternal(pbVar5);
          }
          (this->m_SubtreeHeaders).m_data = (btBvhSubtreeInfo *)0x0;
        }
        (this->m_SubtreeHeaders).m_ownsMemory = true;
        (this->m_SubtreeHeaders).m_data = pbVar12;
        (this->m_SubtreeHeaders).m_capacity = 1;
      }
      piVar1 = &(this->m_SubtreeHeaders).m_size;
      *piVar1 = *piVar1 + 1;
      pbVar10 = (this->m_quantizedContiguousNodes).m_data;
      pbVar12 = (this->m_SubtreeHeaders).m_data;
      pbVar12->m_quantizedAabbMin[0] = pbVar10->m_quantizedAabbMin[0];
      pbVar12->m_quantizedAabbMin[1] = pbVar10->m_quantizedAabbMin[1];
      pbVar12->m_quantizedAabbMin[2] = pbVar10->m_quantizedAabbMin[2];
      pbVar12->m_quantizedAabbMax[0] = pbVar10->m_quantizedAabbMax[0];
      pbVar12->m_quantizedAabbMax[1] = pbVar10->m_quantizedAabbMax[1];
      pbVar12->m_quantizedAabbMax[2] = pbVar10->m_quantizedAabbMax[2];
      pbVar12->m_rootNodeIndex = 0;
      iVar9 = 1;
      if (pbVar10->m_escapeIndexOrTriangleIndex < 0) {
        iVar9 = -pbVar10->m_escapeIndexOrTriangleIndex;
      }
      pbVar12->m_subtreeSize = iVar9;
    }
  }
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  pbVar10 = (this->m_quantizedLeafNodes).m_data;
  if (pbVar10 != (btQuantizedBvhNode *)0x0) {
    if ((this->m_quantizedLeafNodes).m_ownsMemory == true) {
      btAlignedFreeInternal(pbVar10);
    }
    (this->m_quantizedLeafNodes).m_data = (btQuantizedBvhNode *)0x0;
  }
  (this->m_quantizedLeafNodes).m_ownsMemory = true;
  (this->m_quantizedLeafNodes).m_data = (btQuantizedBvhNode *)0x0;
  (this->m_quantizedLeafNodes).m_size = 0;
  (this->m_quantizedLeafNodes).m_capacity = 0;
  ptr_00 = (this->m_leafNodes).m_data;
  if (ptr_00 != (btOptimizedBvhNode *)0x0) {
    if ((this->m_leafNodes).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_00);
    }
    (this->m_leafNodes).m_data = (btOptimizedBvhNode *)0x0;
  }
  (this->m_leafNodes).m_ownsMemory = true;
  (this->m_leafNodes).m_data = (btOptimizedBvhNode *)0x0;
  (this->m_leafNodes).m_size = 0;
  (this->m_leafNodes).m_capacity = 0;
  return;
}

Assistant:

void btQuantizedBvh::buildInternal()
{
	///assumes that caller filled in the m_quantizedLeafNodes
	m_useQuantization = true;
	int numLeafNodes = 0;
	
	if (m_useQuantization)
	{
		//now we have an array of leafnodes in m_leafNodes
		numLeafNodes = m_quantizedLeafNodes.size();

		m_quantizedContiguousNodes.resize(2*numLeafNodes);

	}

	m_curNodeIndex = 0;

	buildTree(0,numLeafNodes);

	///if the entire tree is small then subtree size, we need to create a header info for the tree
	if(m_useQuantization && !m_SubtreeHeaders.size())
	{
		btBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(m_quantizedContiguousNodes[0]);
		subtree.m_rootNodeIndex = 0;
		subtree.m_subtreeSize = m_quantizedContiguousNodes[0].isLeafNode() ? 1 : m_quantizedContiguousNodes[0].getEscapeIndex();
	}

	//PCK: update the copy of the size
	m_subtreeHeaderCount = m_SubtreeHeaders.size();

	//PCK: clear m_quantizedLeafNodes and m_leafNodes, they are temporary
	m_quantizedLeafNodes.clear();
	m_leafNodes.clear();
}